

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<spv::Capability,_8UL> * __thiscall
spirv_cross::SmallVector<spv::Capability,_8UL>::operator=
          (SmallVector<spv::Capability,_8UL> *this,SmallVector<spv::Capability,_8UL> *other)

{
  size_t sVar1;
  Capability *pCVar2;
  Capability *pCVar3;
  size_t sVar4;
  
  if (this != other) {
    (this->super_VectorView<spv::Capability>).buffer_size = 0;
    reserve(this,(other->super_VectorView<spv::Capability>).buffer_size);
    sVar1 = (other->super_VectorView<spv::Capability>).buffer_size;
    if (sVar1 != 0) {
      pCVar2 = (this->super_VectorView<spv::Capability>).ptr;
      pCVar3 = (other->super_VectorView<spv::Capability>).ptr;
      sVar4 = 0;
      do {
        pCVar2[sVar4] = pCVar3[sVar4];
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
    (this->super_VectorView<spv::Capability>).buffer_size = sVar1;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}